

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableHeadersRow(void)

{
  ImGuiTable *table;
  ImVec2 IVar1;
  ImVec2 IVar2;
  bool bVar3;
  uint uVar4;
  int column_n;
  int iVar5;
  int iVar6;
  char *label;
  float row_min_height;
  float fStack_54;
  
  table = GImGui->CurrentTable;
  if (table->IsLayoutLocked == false) {
    TableUpdateLayout(table);
  }
  row_min_height = TableGetHeaderRowHeight();
  TableNextRow(1,row_min_height);
  IVar1 = GetCursorScreenPos();
  if (table->HostSkipItems == false) {
    iVar5 = 0;
    column_n = 0;
    if (GImGui->CurrentTable != (ImGuiTable *)0x0) {
      column_n = GImGui->CurrentTable->ColumnsCount;
    }
    iVar6 = 0;
    if (0 < column_n) {
      iVar6 = column_n;
    }
    for (; iVar6 != iVar5; iVar5 = iVar5 + 1) {
      bVar3 = TableSetColumnIndex(iVar5);
      if (bVar3) {
        uVar4 = TableGetColumnFlags(iVar5);
        label = "";
        if ((uVar4 >> 0xc & 1) == 0) {
          label = TableGetColumnName(iVar5);
        }
        PushID(iVar5);
        TableHeader(label);
        PopID();
      }
    }
    IVar2 = GetMousePos();
    bVar3 = IsMouseReleased(1);
    if (bVar3) {
      if (GImGui->CurrentTable == (ImGuiTable *)0x0) {
        iVar5 = -1;
      }
      else {
        iVar5 = (int)GImGui->CurrentTable->HoveredColumnBody;
      }
      if (((iVar5 == column_n) && (fStack_54 = IVar2.y, IVar1.y <= fStack_54)) &&
         (fStack_54 < row_min_height + IVar1.y)) {
        TableOpenContextMenu(column_n);
        return;
      }
    }
  }
  return;
}

Assistant:

void ImGui::TableHeadersRow()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableHeadersRow() after BeginTable()!");

    // Layout if not already done (this is automatically done by TableNextRow, we do it here solely to facilitate stepping in debugger as it is frequent to step in TableUpdateLayout)
    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);

    // Open row
    const float row_height = TableGetHeaderRowHeight();
    TableNextRow(ImGuiTableRowFlags_Headers, row_height);
    const float row_y1 = GetCursorScreenPos().y;
    if (table->HostSkipItems) // Merely an optimization, you may skip in your own code.
        return;

    const int columns_count = TableGetColumnCount();
    for (int column_n = 0; column_n < columns_count; column_n++)
    {
        if (!TableSetColumnIndex(column_n))
            continue;

        // Push an id to allow unnamed labels (generally accidental, but let's behave nicely with them)
        // In your own code you may omit the PushID/PopID all-together, provided you know they won't collide.
        const char* name = (TableGetColumnFlags(column_n) & ImGuiTableColumnFlags_NoHeaderLabel) ? "" : TableGetColumnName(column_n);
        PushID(column_n);
        TableHeader(name);
        PopID();
    }

    // Allow opening popup from the right-most section after the last column.
    ImVec2 mouse_pos = ImGui::GetMousePos();
    if (IsMouseReleased(1) && TableGetHoveredColumn() == columns_count)
        if (mouse_pos.y >= row_y1 && mouse_pos.y < row_y1 + row_height)
            TableOpenContextMenu(columns_count); // Will open a non-column-specific popup.
}